

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int ly_print(lyout *out,char *format,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 local_54;
  va_list ap;
  char *aux;
  char *msg;
  char *pcStack_20;
  int count;
  char *format_local;
  lyout *out_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  msg._4_4_ = 0;
  aux = (char *)0x0;
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  local_54 = 0x30;
  local_58 = 0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  pcStack_20 = format;
  format_local = (char *)out;
  switch(out->type) {
  case LYOUT_FD:
    msg._4_4_ = vdprintf((out->method).fd,format,&local_58);
    break;
  case LYOUT_STREAM:
    msg._4_4_ = vfprintf((FILE *)(out->method).f,format,&local_58);
    break;
  case LYOUT_MEMORY:
    msg._4_4_ = vasprintf(&aux,format,&local_58);
    if (*(ulong *)(format_local + 0x18) < *(long *)(format_local + 0x10) + (long)msg._4_4_ + 1U) {
      pvVar1 = ly_realloc(*(void **)(format_local + 8),
                          *(long *)(format_local + 0x10) + (long)msg._4_4_ + 1);
      if (pvVar1 == (void *)0x0) {
        format_local[8] = '\0';
        format_local[9] = '\0';
        format_local[10] = '\0';
        format_local[0xb] = '\0';
        format_local[0xc] = '\0';
        format_local[0xd] = '\0';
        format_local[0xe] = '\0';
        format_local[0xf] = '\0';
        format_local[0x10] = '\0';
        format_local[0x11] = '\0';
        format_local[0x12] = '\0';
        format_local[0x13] = '\0';
        format_local[0x14] = '\0';
        format_local[0x15] = '\0';
        format_local[0x16] = '\0';
        format_local[0x17] = '\0';
        format_local[0x18] = '\0';
        format_local[0x19] = '\0';
        format_local[0x1a] = '\0';
        format_local[0x1b] = '\0';
        format_local[0x1c] = '\0';
        format_local[0x1d] = '\0';
        format_local[0x1e] = '\0';
        format_local[0x1f] = '\0';
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_print");
        return -1;
      }
      *(void **)(format_local + 8) = pvVar1;
      *(long *)(format_local + 0x18) = *(long *)(format_local + 0x10) + (long)msg._4_4_ + 1;
    }
    memcpy((void *)(*(long *)(format_local + 8) + *(long *)(format_local + 0x10)),aux,
           (long)msg._4_4_);
    *(long *)(format_local + 0x10) = (long)msg._4_4_ + *(long *)(format_local + 0x10);
    *(undefined1 *)(*(long *)(format_local + 8) + *(long *)(format_local + 0x10)) = 0;
    free(aux);
    break;
  case LYOUT_CALLBACK:
    msg._4_4_ = vasprintf(&aux,format,&local_58);
    msg._4_4_ = (**(code **)(format_local + 8))
                          (*(undefined8 *)(format_local + 0x10),aux,(long)msg._4_4_);
    free(aux);
  }
  return msg._4_4_;
}

Assistant:

int
ly_print(struct lyout *out, const char *format, ...)
{
    int count = 0;
    char *msg = NULL, *aux;
    va_list ap;
#ifndef HAVE_VDPRINTF
    FILE *stream;
#endif

    va_start(ap, format);

    switch (out->type) {
    case LYOUT_FD:
#ifdef HAVE_VDPRINTF
        count = vdprintf(out->method.fd, format, ap);
#else
        stream = fdopen(dup(out->method.fd), "a+");
        if (stream) {
            count = vfprintf(stream, format, ap);
            fclose(stream);
        }
#endif
        break;
    case LYOUT_STREAM:
        count = vfprintf(out->method.f, format, ap);
        break;
    case LYOUT_MEMORY:
        count = vasprintf(&msg, format, ap);
        if (out->method.mem.len + count + 1 > out->method.mem.size) {
            aux = ly_realloc(out->method.mem.buf, out->method.mem.len + count + 1);
            if (!aux) {
                out->method.mem.buf = NULL;
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                va_end(ap);
                return -1;
            }
            out->method.mem.buf = aux;
            out->method.mem.size = out->method.mem.len + count + 1;
        }
        memcpy(&out->method.mem.buf[out->method.mem.len], msg, count);
        out->method.mem.len += count;
        out->method.mem.buf[out->method.mem.len] = '\0';
        free(msg);
        break;
    case LYOUT_CALLBACK:
        count = vasprintf(&msg, format, ap);
        count = out->method.clb.f(out->method.clb.arg, msg, count);
        free(msg);
        break;
    }

    va_end(ap);
    return count;
}